

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode N_VScaleAddMulti_Serial(int nvec,sunrealtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (nvec == 1) {
    N_VLinearSum_Serial(*a,x,1.0,*Y,*Z);
  }
  else {
    uVar4 = *x->content;
    uVar1 = *(ulong *)((long)x->content + 0x10);
    uVar7 = 0;
    if ((long)uVar4 < 1) {
      uVar4 = uVar7;
    }
    if (0 < nvec) {
      uVar7 = (ulong)(uint)nvec;
    }
    uVar6 = 0;
    if (Y == Z) {
      for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
        lVar2 = *(long *)((long)Y[uVar6]->content + 0x10);
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          *(double *)(lVar2 + uVar5 * 8) =
               a[uVar6] * *(double *)(uVar1 + uVar5 * 8) + *(double *)(lVar2 + uVar5 * 8);
        }
      }
    }
    else {
      for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
        lVar2 = *(long *)((long)Y[uVar6]->content + 0x10);
        lVar3 = *(long *)((long)Z[uVar6]->content + 0x10);
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          *(double *)(lVar3 + uVar5 * 8) =
               a[uVar6] * *(double *)(uVar1 + uVar5 * 8) + *(double *)(lVar2 + uVar5 * 8);
        }
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VScaleAddMulti_Serial(int nvec, sunrealtype* a, N_Vector x,
                                   N_Vector* Y, N_Vector* Z)
{
  SUNFunctionBegin(x->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;
  sunrealtype* zd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VLinearSum */
  if (nvec == 1)
  {
    N_VLinearSum_Serial(a[0], x, ONE, Y[0], Z[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z)
  {
    for (i = 0; i < nvec; i++)
    {
      yd = NV_DATA_S(Y[i]);
      for (j = 0; j < N; j++) { yd[j] += a[i] * xd[j]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i = 0; i < nvec; i++)
  {
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = a[i] * xd[j] + yd[j]; }
  }
  return SUN_SUCCESS;
}